

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_is_char(asmcode *code,compiler_options *param_2)

{
  operand local_64;
  operation local_60 [2];
  operand local_58 [2];
  operation local_50 [2];
  operand local_48 [2];
  operation local_40;
  operand local_3c [2];
  operation local_34;
  operand local_30;
  operation local_2c [2];
  operand local_24 [2];
  operation local_1c;
  compiler_options *local_18;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  local_1c = CMP;
  local_24[1] = 5;
  local_24[0] = NUMBER;
  local_2c[1] = 0x17;
  local_18 = param_2;
  param_1_local = (compiler_options *)code;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1c,local_24 + 1,local_24,(int *)(local_2c + 1));
  local_2c[0] = SETE;
  local_30 = AL;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,local_2c,&local_30);
  local_34 = MOVZX;
  local_3c[1] = 9;
  local_3c[0] = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_34,local_3c + 1,local_3c);
  local_40 = SHL;
  local_48[1] = 9;
  local_48[0] = NUMBER;
  local_50[1] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,&local_40,local_48 + 1,local_48,(int *)(local_50 + 1));
  local_50[0] = OR;
  local_58[1] = 9;
  local_58[0] = NUMBER;
  local_60[1] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,local_50,local_58 + 1,local_58,(int *)(local_60 + 1));
  local_60[0] = JMP;
  local_64 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,local_60,&local_64);
  return;
}

Assistant:

void compile_is_char(asmcode& code, const compiler_options&)
  {
  code.add(asmcode::CMP, asmcode::CL, asmcode::NUMBER, char_tag);
  // if comparison (last cmp call) succeeded, then sete puts 1 in al, otherwise 0
  code.add(asmcode::SETE, asmcode::AL);
  // movzx extends the bits in al to the full rax register
  code.add(asmcode::MOVZX, asmcode::RAX, asmcode::AL);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 3);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::JMP, CONTINUE);
  }